

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.h
# Opt level: O2

void __thiscall gutil::Parameter::nextValue<double>(Parameter *this,double *v)

{
  IOException *this_00;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  istringstream in;
  byte abStack_178 [352];
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  nextString(this,&s,(char *)0x0);
  std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)&s,_S_in);
  std::istream::_M_extract<double>((double *)&in);
  if ((abStack_178[*(long *)(_in + -0x18)] & 5) == 0) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&in);
    std::__cxx11::string::~string((string *)&s);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_1b8,"Format error of argument: ",&s);
  IOException::IOException(this_00,&local_1b8);
  __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

void nextValue(T &v)
    {
      std::string s;

      nextString(s);

      std::istringstream in(s);
      in >> v;

      if (in.fail())
      {
        throw IOException("Format error of argument: "+s);
      }
    }